

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,char *filename,NameSet *rowNames,NameSet *colNames,DIdxSet *intVars,bool unscale,
           bool writeZeroObjective)

{
  Verbosity VVar1;
  ostream *poVar2;
  char cVar3;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined7 in_register_00000089;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *origLP;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  if (((int)CONCAT71(in_register_00000089,unscale) == 0) || (this->_realLP->_isScaled != true)) {
    (*(this->_realLP->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x22])
              (this->_realLP,filename,rowNames,colNames,intVars,(ulong)writeZeroObjective);
  }
  else {
    VVar1 = (this->spxout).m_verbosity;
    if (4 < (int)VVar1) {
      (this->spxout).m_verbosity = INFO3;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[5],"copy LP to write unscaled original problem",0x2a);
      poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar3 = (char)poVar2;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar1;
    }
    local_38 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
    spx_alloc<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&local_38,1);
    this_00 = local_38;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SPxLPBase(local_38,this->_realLP);
    local_38 = this_00;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unscaleLP(this_00);
    (*(local_38->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x22])
              (local_38,filename,rowNames,colNames,intVars,(ulong)writeZeroObjective);
    (**(local_38->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .
       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._vptr_ClassArray)();
    free(local_38);
  }
  return true;
}

Assistant:

bool SoPlexBase<R>::writeFile(const char* filename, const NameSet* rowNames,
                              const NameSet* colNames, const DIdxSet* intVars, const bool unscale,
                              const bool writeZeroObjective) const
{
   ///@todo implement return value
   if(unscale && _realLP->isScaled())
   {
      SPX_MSG_INFO3(spxout, spxout << "copy LP to write unscaled original problem" << std::endl;)
      SPxLPBase<R>* origLP;
      origLP = nullptr;
      spx_alloc(origLP);
      origLP = new(origLP) SPxLPBase<R>(*_realLP);
      origLP->unscaleLP();
      origLP->writeFileLPBase(filename, rowNames, colNames, intVars, writeZeroObjective);
      origLP->~SPxLPBase<R>();
      spx_free(origLP);
   }
   else
      _realLP->writeFileLPBase(filename, rowNames, colNames, intVars, writeZeroObjective);

   return true;
}